

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O0

void __thiscall
xemmai::t_type_of<xemmai::t_fiber>::f_do_instantiate
          (t_type_of<xemmai::t_fiber> *this,t_pvalue *a_stack,size_t a_n)

{
  t_engine *ptVar1;
  t_object *ptVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  wstring_view a_message;
  size_t local_38;
  size_t size;
  size_t a_n_local;
  t_pvalue *a_stack_local;
  t_type_of<xemmai::t_fiber> *this_local;
  
  if ((a_n != 1) && (a_n != 2)) {
    bVar3 = sv(L"must be called with 1 or 2 argument(s).",0x27);
    a_message._M_str = bVar3._M_str;
    size = bVar3._M_len;
    a_message._M_len = (size_t)a_message._M_str;
    f_throw((xemmai *)size,a_message);
  }
  ptVar1 = f_engine();
  local_38 = (ptVar1->v_options).v_stack_size;
  if (a_n == 2) {
    ptVar2 = t_pointer::operator_cast_to_t_object_(&a_stack[3].super_t_pointer);
    f_check<unsigned_long>(ptVar2,L"argument1");
    local_38 = f_as<unsigned_long,xemmai::t_value<xemmai::t_pointer>&>(a_stack + 3);
  }
  ptVar2 = t_fiber::f_instantiate(a_stack + 2,local_38);
  t_pointer::operator=(&a_stack->super_t_pointer,ptVar2);
  return;
}

Assistant:

void t_type_of<t_fiber>::f_do_instantiate(t_pvalue* a_stack, size_t a_n)
{
	if (a_n != 1 && a_n != 2) f_throw(L"must be called with 1 or 2 argument(s)."sv);
	auto size = f_engine()->v_options.v_stack_size;
	if (a_n == 2) {
		f_check<size_t>(a_stack[3], L"argument1");
		size = f_as<size_t>(a_stack[3]);
	}
	a_stack[0] = t_fiber::f_instantiate(a_stack[2], size);
}